

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadSections(BinaryReader *this,ReadSectionsOptions *options)

{
  bool bVar1;
  byte bVar2;
  Result RVar3;
  BinarySectionOrder BVar4;
  int iVar5;
  Enum EVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  char *format;
  Enum EVar13;
  uint8_t section_code;
  uint32_t value;
  bool seen_section_code [14];
  byte local_5d;
  BinarySectionOrder local_5c;
  size_t local_58;
  uint local_4c;
  char acStack_48 [16];
  ReadSectionsOptions *local_38;
  
  acStack_48[8] = '\0';
  acStack_48[9] = '\0';
  acStack_48[10] = '\0';
  acStack_48[0xb] = '\0';
  acStack_48[0xc] = '\0';
  acStack_48[0xd] = '\0';
  acStack_48[0] = '\0';
  acStack_48[1] = '\0';
  acStack_48[2] = '\0';
  acStack_48[3] = '\0';
  acStack_48[4] = '\0';
  acStack_48[5] = '\0';
  acStack_48[6] = '\0';
  acStack_48[7] = '\0';
  EVar6 = Ok;
  if ((this->state_).offset < (this->state_).size) {
    uVar12 = 0;
    EVar13 = Ok;
    local_38 = options;
    do {
      RVar3 = ReadU8(this,&local_5d,"section code");
      if (RVar3.enum_ == Error) {
LAB_00122b6f:
        bVar1 = true;
      }
      else {
        RVar3 = ReadU32Leb128(this,&local_4c,"section size");
        bVar2 = local_5d;
        uVar9 = (ulong)local_4c;
        if (RVar3.enum_ == Error) goto LAB_00122b6f;
        sVar11 = this->read_end_;
        uVar7 = (this->state_).offset + uVar9;
        this->read_end_ = uVar7;
        uVar10 = (ulong)local_5d;
        if (local_5d < 0xe) {
          if (uVar10 != 0) {
            if (acStack_48[uVar10] == '\x01') {
              pcVar8 = GetSectionName((uint)local_5d);
              PrintError(this,"multiple %s sections",pcVar8);
              bVar1 = true;
              goto LAB_00122cd1;
            }
            acStack_48[uVar10] = '\x01';
          }
          local_58 = sVar11;
          if ((this->state_).size < uVar7) {
            pcVar8 = "invalid section size: extends past end";
LAB_00122c28:
            PrintError(this,pcVar8);
          }
          else {
            if (((uint)local_5d == Custom) || (this->last_known_section_ == Invalid)) {
LAB_00122c65:
              if ((uVar10 == 0) || (this->did_read_names_section_ == false)) {
                iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                                  (this->delegate_,uVar12,uVar10,uVar9);
                if (iVar5 == 0) {
                  local_5c = (BinarySectionOrder)
                             CONCAT71((int7)(uVar9 >> 8),this->options_->stop_on_first_error);
                  EVar6 = (*(code *)(&DAT_00149878 + *(int *)(&DAT_00149878 + uVar10 * 4)))();
                  return (Result)EVar6;
                }
                pcVar8 = "BeginSection callback failed";
                goto LAB_00122c28;
              }
              pcVar8 = GetSectionName((uint)bVar2);
              format = "%s section can not occur after Name section";
            }
            else {
              local_5c = GetSectionOrder((uint)local_5d);
              BVar4 = GetSectionOrder(this->last_known_section_);
              if ((int)BVar4 < (int)local_5c) goto LAB_00122c65;
              pcVar8 = GetSectionName((uint)bVar2);
              format = "section %s out of order";
            }
            PrintError(this,format,pcVar8);
          }
          bVar1 = true;
          sVar11 = local_58;
        }
        else {
          PrintError(this,"invalid section code: %u");
          bVar1 = true;
          if (local_38->stop_on_first_error == false) {
            (this->state_).offset = this->read_end_;
            bVar1 = false;
            EVar13 = Error;
          }
        }
LAB_00122cd1:
        this->read_end_ = sVar11;
      }
      EVar6 = Error;
    } while ((!bVar1) &&
            (uVar12 = (ulong)((int)uVar12 + 1), EVar6 = EVar13,
            (this->state_).offset < (this->state_).size));
  }
  return (Result)EVar6;
}

Assistant:

Result BinaryReader::ReadSections(const ReadSectionsOptions& options) {
  Result result = Result::Ok;
  Index section_index = 0;
  bool seen_section_code[static_cast<int>(BinarySection::Last) + 1] = {false};

  for (; state_.offset < state_.size; ++section_index) {
    uint8_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU8(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u", section_code);
      if (options.stop_on_first_error) {
        return Result::Error;
      }
      // If we don't have to stop on first error, continue reading
      // sections, because although we could not understand the
      // current section, we can continue and correctly parse
      // subsequent sections, so we can give back as much information
      // as we can understand.
      result = Result::Error;
      state_.offset = read_end_;
      continue;
    }

    BinarySection section = static_cast<BinarySection>(section_code);
    if (section != BinarySection::Custom) {
      if (seen_section_code[section_code]) {
        PrintError("multiple %s sections", GetSectionName(section));
        return Result::Error;
      }
      seen_section_code[section_code] = true;
    }

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(
        last_known_section_ == BinarySection::Invalid ||
            section == BinarySection::Custom ||
            GetSectionOrder(section) > GetSectionOrder(last_known_section_),
        "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section_index, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_index, section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Tag:
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadTagSection(section_size);
        result |= section_result;
        break;
      case BinarySection::DataCount:
        ERROR_UNLESS(options_.features.bulk_memory_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadDataCountSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Succeeded(section_result) && state_.offset != read_end_) {
      PrintError("unfinished section (expected end: 0x%" PRIzx ")", read_end_);
      section_result = Result::Error;
      result |= section_result;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }

    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}